

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

void __thiscall ImGuiWindowTempData::ImGuiWindowTempData(ImGuiWindowTempData *this)

{
  ImVec2 IVar1;
  
  (this->CurrentLineSize).x = 0.0;
  (this->CurrentLineSize).y = 0.0;
  this->CurrentLineTextBaseOffset = 0.0;
  (this->PrevLineSize).x = 0.0;
  (this->CursorStartPos).x = 0.0;
  (this->CursorStartPos).y = 0.0;
  (this->CursorMaxPos).x = 0.0;
  (this->CursorMaxPos).y = 0.0;
  (this->CursorPos).x = 0.0;
  (this->CursorPos).y = 0.0;
  (this->CursorPosPrevLine).x = 0.0;
  (this->CursorPosPrevLine).y = 0.0;
  *(undefined8 *)&(this->PrevLineSize).y = 0;
  (this->ChildWindows).Size = 0;
  (this->ChildWindows).Capacity = 0;
  (this->ChildWindows).Data = (ImGuiWindow **)0x0;
  (this->ItemFlagsStack).Size = 0;
  (this->ItemFlagsStack).Capacity = 0;
  (this->ItemFlagsStack).Data = (int *)0x0;
  (this->ItemWidthStack).Size = 0;
  (this->ItemWidthStack).Capacity = 0;
  (this->ItemWidthStack).Data = (float *)0x0;
  (this->TextWrapPosStack).Size = 0;
  (this->TextWrapPosStack).Capacity = 0;
  (this->TextWrapPosStack).Data = (float *)0x0;
  (this->GroupStack).Size = 0;
  (this->GroupStack).Capacity = 0;
  (this->GroupStack).Data = (ImGuiGroupData *)0x0;
  this->LogLinePosY = -1.0;
  this->TreeDepth = 0;
  this->TreeDepthMayJumpToParentOnPop = 0;
  this->LastItemId = 0;
  this->LastItemStatusFlags = 0;
  (this->LastItemDisplayRect).Min.x = 3.4028235e+38;
  (this->LastItemDisplayRect).Min.y = 3.4028235e+38;
  (this->LastItemDisplayRect).Max.x = -3.4028235e+38;
  (this->LastItemDisplayRect).Max.y = -3.4028235e+38;
  IVar1 = (this->LastItemDisplayRect).Max;
  (this->LastItemRect).Min = (this->LastItemDisplayRect).Min;
  (this->LastItemRect).Max = IVar1;
  this->NavLayerCurrent = ImGuiNavLayer_Main;
  this->NavLayerCurrentMask = 1;
  this->NavLayerActiveMask = 0;
  this->NavLayerActiveMaskNext = 0;
  this->NavHideHighlightOneFrame = false;
  this->NavHasScroll = false;
  this->MenuBarAppending = false;
  (this->MenuBarOffset).x = 0.0;
  (this->MenuBarOffset).y = 0.0;
  this->StateStorage = (ImGuiStorage *)0x0;
  this->ParentLayoutType = 1;
  this->LayoutType = 1;
  this->ItemFlags = 0;
  this->ItemWidth = 0.0;
  this->TextWrapPos = -1.0;
  this->StackSizesBackup[0] = 0;
  this->StackSizesBackup[1] = 0;
  this->StackSizesBackup[2] = 0;
  this->StackSizesBackup[3] = 0;
  *(undefined8 *)(this->StackSizesBackup + 4) = 0;
  this->GroupOffset = 0.0;
  this->ColumnsOffset = 0.0;
  this->ColumnsSet = (ImGuiColumnsSet *)0x0;
  return;
}

Assistant:

ImGuiWindowTempData()
    {
        CursorPos = CursorPosPrevLine = CursorStartPos = CursorMaxPos = ImVec2(0.0f, 0.0f);
        CurrentLineSize = PrevLineSize = ImVec2(0.0f, 0.0f);
        CurrentLineTextBaseOffset = PrevLineTextBaseOffset = 0.0f;
        LogLinePosY = -1.0f;
        TreeDepth = 0;
        TreeDepthMayJumpToParentOnPop = 0x00;
        LastItemId = 0;
        LastItemStatusFlags = 0;
        LastItemRect = LastItemDisplayRect = ImRect();
        NavLayerActiveMask = NavLayerActiveMaskNext = 0x00;
        NavLayerCurrent = ImGuiNavLayer_Main;
        NavLayerCurrentMask = (1 << ImGuiNavLayer_Main);
        NavHideHighlightOneFrame = false;
        NavHasScroll = false;
        MenuBarAppending = false;
        MenuBarOffset = ImVec2(0.0f, 0.0f);
        StateStorage = NULL;
        LayoutType = ParentLayoutType = ImGuiLayoutType_Vertical;
        ItemWidth = 0.0f;
        ItemFlags = ImGuiItemFlags_Default_;
        TextWrapPos = -1.0f;
        memset(StackSizesBackup, 0, sizeof(StackSizesBackup));

        Indent = ImVec1(0.0f);
        GroupOffset = ImVec1(0.0f);
        ColumnsOffset = ImVec1(0.0f);
        ColumnsSet = NULL;
    }